

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O1

void ssh1mainchan_start_shell(SshChannel *sc,_Bool want_reply)

{
  long lVar1;
  undefined7 in_register_00000031;
  code *handler;
  
  lVar1 = (*(code *)((sc[0xd].cl)->logctx->queue).tail)(0xc);
  pq_base_push((PacketQueueBase *)sc[0xe].cl,(PacketQueueNode *)(lVar1 + 0x40));
  handler = ssh1mainchan_succfail_nowantreply;
  if ((int)CONCAT71(in_register_00000031,want_reply) != 0) {
    handler = ssh1mainchan_succfail_wantreply;
  }
  ssh1_queue_succfail_handler((ssh1_connection_state *)(sc + -2),handler,(void *)0x0,true);
  return;
}

Assistant:

static void ssh1mainchan_start_shell(SshChannel *sc, bool want_reply)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_CMSG_EXEC_SHELL);
    pq_push(s->ppl.out_pq, pktout);

    ssh1mainchan_queue_response(s, want_reply, true);
}